

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O1

bool CoreML::Specification::operator==
               (KNearestNeighborsClassifier *a,KNearestNeighborsClassifier *b)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  bool bVar5;
  Type *pTVar6;
  Type *pTVar7;
  undefined1 *puVar8;
  long *plVar9;
  int iVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  long lVar14;
  NearestNeighborsIndex aIndex;
  NearestNeighborsIndex bIndex;
  NearestNeighborsIndex local_d0;
  NearestNeighborsIndex local_80;
  
  puVar11 = (undefined1 *)a->nearestneighborsindex_;
  if ((NearestNeighborsIndex *)puVar11 == (NearestNeighborsIndex *)0x0) {
    puVar11 = _NearestNeighborsIndex_default_instance_;
  }
  NearestNeighborsIndex::NearestNeighborsIndex(&local_d0,(NearestNeighborsIndex *)puVar11);
  puVar11 = (undefined1 *)b->nearestneighborsindex_;
  if ((NearestNeighborsIndex *)puVar11 == (NearestNeighborsIndex *)0x0) {
    puVar11 = _NearestNeighborsIndex_default_instance_;
  }
  NearestNeighborsIndex::NearestNeighborsIndex(&local_80,(NearestNeighborsIndex *)puVar11);
  if ((local_d0.numberofdimensions_ == local_80.numberofdimensions_) &&
     (local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_ ==
      local_80.floatsamples_.super_RepeatedPtrFieldBase.current_size_)) {
    if (0 < local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_) {
      iVar10 = 0;
      do {
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_d0.floatsamples_.super_RepeatedPtrFieldBase,iVar10);
        iVar1 = (pTVar6->vector_).current_size_;
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_80.floatsamples_.super_RepeatedPtrFieldBase,iVar10);
        if (iVar1 != (pTVar6->vector_).current_size_) goto LAB_00346e5b;
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_d0.floatsamples_.super_RepeatedPtrFieldBase,iVar10);
        pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_80.floatsamples_.super_RepeatedPtrFieldBase,iVar10);
        bVar5 = operator==(&pTVar6->vector_,&pTVar7->vector_);
        if (!bVar5) goto LAB_00346e5b;
        iVar10 = iVar10 + 1;
      } while (iVar10 < local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_);
    }
    if ((local_d0._oneof_case_[0] == local_80._oneof_case_[0]) &&
       (local_d0._oneof_case_[1] == local_80._oneof_case_[1])) {
      puVar11 = (undefined1 *)a->numberofneighbors_;
      if ((Int64Parameter *)puVar11 == (Int64Parameter *)0x0) {
        puVar11 = _Int64Parameter_default_instance_;
      }
      puVar8 = (undefined1 *)b->numberofneighbors_;
      if ((Int64Parameter *)puVar8 == (Int64Parameter *)0x0) {
        puVar8 = _Int64Parameter_default_instance_;
      }
      if (((Int64Parameter *)puVar11)->defaultvalue_ == ((Int64Parameter *)puVar8)->defaultvalue_) {
        uVar2 = ((Int64Parameter *)puVar11)->_oneof_case_[0];
        uVar3 = ((Int64Parameter *)puVar8)->_oneof_case_[0];
        if (uVar2 == uVar3) {
          if (uVar2 == 0xb) {
            puVar12 = _Int64Set_default_instance_;
            puVar13 = _Int64Set_default_instance_;
            if (uVar2 == 0xb) {
              puVar13 = (undefined1 *)(((Int64Parameter *)puVar11)->AllowedValues_).set_;
            }
            iVar10 = (((Int64Set *)puVar13)->values_).current_size_;
            if (uVar3 == 0xb) {
              puVar12 = (undefined1 *)(((Int64Parameter *)puVar8)->AllowedValues_).set_;
            }
            if (iVar10 != (((Int64Set *)puVar12)->values_).current_size_) goto LAB_00346e5b;
            if (0 < iVar10) {
              lVar14 = 0;
              do {
                puVar11 = (undefined1 *)a->numberofneighbors_;
                if ((Int64Parameter *)puVar11 == (Int64Parameter *)0x0) {
                  puVar11 = _Int64Parameter_default_instance_;
                }
                puVar8 = _Int64Set_default_instance_;
                if (((Int64Parameter *)puVar11)->_oneof_case_[0] == 0xb) {
                  puVar8 = (undefined1 *)(((Int64Parameter *)puVar11)->AllowedValues_).set_;
                }
                plVar9 = google::protobuf::RepeatedField<long>::Get
                                   (&((Int64Set *)puVar8)->values_,(int)lVar14);
                puVar11 = (undefined1 *)b->numberofneighbors_;
                if ((Int64Parameter *)puVar11 == (Int64Parameter *)0x0) {
                  puVar11 = _Int64Parameter_default_instance_;
                }
                puVar8 = _Int64Set_default_instance_;
                if (((Int64Parameter *)puVar11)->_oneof_case_[0] == 0xb) {
                  puVar8 = (undefined1 *)(((Int64Parameter *)puVar11)->AllowedValues_).set_;
                }
                lVar4 = *plVar9;
                plVar9 = google::protobuf::RepeatedField<long>::Get
                                   (&((Int64Set *)puVar8)->values_,(int)lVar14);
                if (lVar4 != *plVar9) goto LAB_00346e5b;
                lVar14 = lVar14 + 1;
              } while (iVar10 != lVar14);
            }
          }
          else if (uVar2 == 10) {
            puVar12 = _Int64Range_default_instance_;
            puVar13 = _Int64Range_default_instance_;
            if (uVar2 == 10) {
              puVar13 = (undefined1 *)(((Int64Parameter *)puVar11)->AllowedValues_).range_;
            }
            if (uVar3 == 10) {
              puVar12 = (undefined1 *)(((Int64Parameter *)puVar8)->AllowedValues_).range_;
            }
            if ((((Int64Range *)puVar13)->minvalue_ != ((Int64Range *)puVar12)->minvalue_) ||
               (((Int64Range *)puVar13)->maxvalue_ != ((Int64Range *)puVar12)->maxvalue_))
            goto LAB_00346e5b;
          }
          uVar2 = a->_oneof_case_[0];
          uVar3 = b->_oneof_case_[0];
          if (uVar2 == uVar3) {
            if (uVar2 == 0) {
              bVar5 = true;
              goto LAB_00346e5d;
            }
            if (uVar2 == 100) {
              puVar8 = _StringVector_default_instance_;
              puVar11 = _StringVector_default_instance_;
              if (uVar2 == 100) {
                puVar11 = (undefined1 *)(a->ClassLabels_).stringclasslabels_;
              }
              if (uVar3 == 100) {
                puVar8 = (undefined1 *)(b->ClassLabels_).stringclasslabels_;
              }
              bVar5 = vectorsEqual<CoreML::Specification::StringVector>
                                ((StringVector *)puVar11,(StringVector *)puVar8);
              goto LAB_00346e5d;
            }
            if (uVar2 == 0x65) {
              puVar8 = _Int64Vector_default_instance_;
              puVar11 = _Int64Vector_default_instance_;
              if (uVar2 == 0x65) {
                puVar11 = (undefined1 *)(a->ClassLabels_).int64classlabels_;
              }
              if (uVar3 == 0x65) {
                puVar8 = (undefined1 *)(b->ClassLabels_).int64classlabels_;
              }
              bVar5 = vectorsEqual<CoreML::Specification::Int64Vector>
                                ((Int64Vector *)puVar11,(Int64Vector *)puVar8);
              goto LAB_00346e5d;
            }
          }
        }
      }
    }
  }
LAB_00346e5b:
  bVar5 = false;
LAB_00346e5d:
  NearestNeighborsIndex::~NearestNeighborsIndex(&local_80);
  NearestNeighborsIndex::~NearestNeighborsIndex(&local_d0);
  return bVar5;
}

Assistant:

bool operator==(const KNearestNeighborsClassifier& a,
                        const KNearestNeighborsClassifier& b) {
            auto aIndex = a.nearestneighborsindex();
            auto bIndex = b.nearestneighborsindex();
            if (aIndex.numberofdimensions() != bIndex.numberofdimensions()) {
                return false;
            }
            if (aIndex.floatsamples_size() != bIndex.floatsamples_size()) {
                return false;
            }
            for (int i = 0; i < aIndex.floatsamples_size(); i++) {
                if (aIndex.floatsamples(i).vector_size() != bIndex.floatsamples(i).vector_size()) {
                    return false;
                }
                if (aIndex.floatsamples(i).vector() != bIndex.floatsamples(i).vector()) {
                    return false;
                }
            }
            if (aIndex.IndexType_case() != bIndex.IndexType_case()) {
                return false;
            }
            if (aIndex.DistanceFunction_case() != bIndex.DistanceFunction_case()) {
                return false;
            }
            if (a.numberofneighbors().defaultvalue() != b.numberofneighbors().defaultvalue()) {
                return false;
            }
            if (a.numberofneighbors().AllowedValues_case() != b.numberofneighbors().AllowedValues_case()) {
                return false;
            }
            switch (a.numberofneighbors().AllowedValues_case()) {
                case Specification::Int64Parameter::AllowedValuesCase::kRange:
                {
                    if (a.numberofneighbors().range().minvalue() != b.numberofneighbors().range().minvalue() || a.numberofneighbors().range().maxvalue() != b.numberofneighbors().range().maxvalue()) {
                        return false;
                    }
                    break;
                }
                case Specification::Int64Parameter::AllowedValuesCase::kSet:
                {
                    if (a.numberofneighbors().set().values_size() != b.numberofneighbors().set().values_size()) {
                        return false;
                    }
                    int64_t count = a.numberofneighbors().set().values_size();
                    for (int64_t i = 0; i < count; i++) {
                        if (a.numberofneighbors().set().values((int)i) != b.numberofneighbors().set().values((int)i)) {
                            return false;
                        }
                    } // for i in set
                    break;
                } // case kSet
                case Specification::Int64Parameter::AllowedValuesCase::ALLOWEDVALUES_NOT_SET:
                    break;
            } // switch AllowedValuesCase
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case KNearestNeighborsClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case KNearestNeighborsClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case KNearestNeighborsClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
            if (a.WeightingScheme_case() != b.WeightingScheme_case()) {
                return false;
            }
        }